

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_encoding.cc
# Opt level: O0

bool draco::EncodeRawSymbols<draco::RAnsSymbolEncoder>
               (uint32_t *symbols,int num_values,uint32_t max_entry_value,int32_t num_unique_symbols
               ,Options *options,EncoderBuffer *target_buffer)

{
  int *piVar1;
  uint32_t in_ECX;
  EncoderBuffer *in_R8;
  int compression_level;
  int unique_symbols_bit_length;
  int symbol_bits;
  string *in_stack_ffffffffffffff18;
  Options *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  EncoderBuffer *in_stack_ffffffffffffff48;
  allocator<char> *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  byte bVar2;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff5f;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string local_98 [35];
  byte local_75;
  byte local_62;
  allocator<char> local_61;
  string local_60 [16];
  EncoderBuffer *in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  int local_38;
  int local_34;
  EncoderBuffer *local_28;
  bool local_1;
  
  local_34 = 0;
  local_28 = in_R8;
  if (0 < (int)in_ECX) {
    local_34 = MostSignificantBit(in_ECX);
  }
  local_38 = local_34 + 1;
  if (local_38 < 0x13) {
    iVar4 = 7;
    local_62 = 0;
    local_75 = 0;
    bVar2 = false;
    if (local_28 != (EncoderBuffer *)0x0) {
      in_stack_ffffffffffffff50 = &local_61;
      std::allocator<char>::allocator();
      local_62 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(bVar2,in_stack_ffffffffffffff58)),
                 in_stack_ffffffffffffff50);
      local_75 = 1;
      in_stack_ffffffffffffff47 =
           Options::IsOptionSet(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff48 = local_28;
      bVar2 = in_stack_ffffffffffffff47;
    }
    uVar3 = bVar2;
    if ((local_75 & 1) != 0) {
      std::__cxx11::string::~string(local_60);
    }
    if ((local_62 & 1) != 0) {
      std::allocator<char>::~allocator(&local_61);
    }
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (char *)CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(uVar3,in_stack_ffffffffffffff58)),
                 in_stack_ffffffffffffff50);
      iVar4 = Options::GetInt(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    }
    if (iVar4 < 4) {
      local_38 = local_38 + -2;
    }
    else if (iVar4 < 6) {
      local_38 = local_38 + -1;
    }
    else if (iVar4 < 10) {
      if (7 < iVar4) {
        local_38 = local_38 + 1;
      }
    }
    else {
      local_38 = local_38 + 2;
    }
    piVar1 = std::max<int>((int *)&stack0xffffffffffffff60,&local_38);
    piVar1 = std::min<int>(piVar1,&kMaxRawEncodingBitLength);
    local_38 = *piVar1;
    EncoderBuffer::Encode<unsigned_char>
              (in_stack_ffffffffffffff48,
               (uchar *)CONCAT17(in_stack_ffffffffffffff47,CONCAT16(bVar2,in_stack_ffffffffffffff40)
                                ));
    switch(local_38) {
    case 0:
    case 1:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<1>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 2:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<2>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 3:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<3>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 4:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<4>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 5:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<5>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 6:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<6>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 7:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<7>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 8:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<8>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 9:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<9>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 10:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<10>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 0xb:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<11>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 0xc:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<12>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 0xd:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<13>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 0xe:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<14>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 0xf:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<15>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 0x10:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<16>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 0x11:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<17>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    case 0x12:
      local_1 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<18>>
                          ((uint32_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
      break;
    default:
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool EncodeRawSymbols(const uint32_t *symbols, int num_values,
                      uint32_t max_entry_value, int32_t num_unique_symbols,
                      const Options *options, EncoderBuffer *target_buffer) {
  int symbol_bits = 0;
  if (num_unique_symbols > 0) {
    symbol_bits = MostSignificantBit(num_unique_symbols);
  }
  int unique_symbols_bit_length = symbol_bits + 1;
  // Currently, we don't support encoding of more than 2^18 unique symbols.
  if (unique_symbols_bit_length > kMaxRawEncodingBitLength) {
    return false;
  }
  int compression_level = kDefaultSymbolCodingCompressionLevel;
  if (options != nullptr &&
      options->IsOptionSet("symbol_encoding_compression_level")) {
    compression_level = options->GetInt("symbol_encoding_compression_level");
  }

  // Adjust the bit_length based on compression level. Lower compression levels
  // will use fewer bits while higher compression levels use more bits. Note
  // that this is going to work for all valid bit_lengths because the actual
  // number of bits allocated for rANS encoding is hard coded as:
  // std::max(12, 3 * bit_length / 2) , therefore there will be always a
  // sufficient number of bits available for all symbols.
  // See ComputeRAnsPrecisionFromUniqueSymbolsBitLength() for the formula.
  // This hardcoded equation cannot be changed without changing the bitstream.
  if (compression_level < 4) {
    unique_symbols_bit_length -= 2;
  } else if (compression_level < 6) {
    unique_symbols_bit_length -= 1;
  } else if (compression_level > 9) {
    unique_symbols_bit_length += 2;
  } else if (compression_level > 7) {
    unique_symbols_bit_length += 1;
  }
  // Clamp the bit_length to a valid range.
  unique_symbols_bit_length = std::min(std::max(1, unique_symbols_bit_length),
                                       kMaxRawEncodingBitLength);
  target_buffer->Encode(static_cast<uint8_t>(unique_symbols_bit_length));
  // Use appropriate symbol encoder based on the maximum symbol bit length.
  switch (unique_symbols_bit_length) {
    case 0:
      FALLTHROUGH_INTENDED;
    case 1:
      return EncodeRawSymbolsInternal<SymbolEncoderT<1>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 2:
      return EncodeRawSymbolsInternal<SymbolEncoderT<2>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 3:
      return EncodeRawSymbolsInternal<SymbolEncoderT<3>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 4:
      return EncodeRawSymbolsInternal<SymbolEncoderT<4>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 5:
      return EncodeRawSymbolsInternal<SymbolEncoderT<5>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 6:
      return EncodeRawSymbolsInternal<SymbolEncoderT<6>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 7:
      return EncodeRawSymbolsInternal<SymbolEncoderT<7>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 8:
      return EncodeRawSymbolsInternal<SymbolEncoderT<8>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 9:
      return EncodeRawSymbolsInternal<SymbolEncoderT<9>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 10:
      return EncodeRawSymbolsInternal<SymbolEncoderT<10>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 11:
      return EncodeRawSymbolsInternal<SymbolEncoderT<11>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 12:
      return EncodeRawSymbolsInternal<SymbolEncoderT<12>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 13:
      return EncodeRawSymbolsInternal<SymbolEncoderT<13>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 14:
      return EncodeRawSymbolsInternal<SymbolEncoderT<14>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 15:
      return EncodeRawSymbolsInternal<SymbolEncoderT<15>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 16:
      return EncodeRawSymbolsInternal<SymbolEncoderT<16>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 17:
      return EncodeRawSymbolsInternal<SymbolEncoderT<17>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 18:
      return EncodeRawSymbolsInternal<SymbolEncoderT<18>>(
          symbols, num_values, max_entry_value, target_buffer);
    default:
      return false;
  }
}